

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void gpu_init_error_queue(void)

{
  char *pcVar1;
  uint local_c;
  uint i;
  
  if (_gpu_error_code_queue == (GPU_ErrorObject *)0x0) {
    _gpu_error_code_queue = (GPU_ErrorObject *)SDL_malloc((ulong)_gpu_error_code_queue_size * 0x18);
    for (local_c = 0; local_c < _gpu_error_code_queue_size; local_c = local_c + 1) {
      pcVar1 = (char *)SDL_malloc(0x81);
      _gpu_error_code_queue[local_c].function = pcVar1;
      _gpu_error_code_queue[local_c].error = GPU_ERROR_NONE;
      pcVar1 = (char *)SDL_malloc(0x201);
      _gpu_error_code_queue[local_c].details = pcVar1;
    }
    _gpu_num_error_codes = 0;
    _gpu_error_code_result.function = (char *)SDL_malloc(0x81);
    _gpu_error_code_result.error = GPU_ERROR_NONE;
    _gpu_error_code_result.details = (char *)SDL_malloc(0x201);
  }
  return;
}

Assistant:

static void gpu_init_error_queue(void)
{
    if(_gpu_error_code_queue == NULL)
    {
        unsigned int i;
        _gpu_error_code_queue = (GPU_ErrorObject*)SDL_malloc(sizeof(GPU_ErrorObject)*_gpu_error_code_queue_size);

        for(i = 0; i < _gpu_error_code_queue_size; i++)
        {
            _gpu_error_code_queue[i].function = (char*)SDL_malloc(GPU_ERROR_FUNCTION_STRING_MAX+1);
            _gpu_error_code_queue[i].error = GPU_ERROR_NONE;
            _gpu_error_code_queue[i].details = (char*)SDL_malloc(GPU_ERROR_DETAILS_STRING_MAX+1);
        }
        _gpu_num_error_codes = 0;

        _gpu_error_code_result.function = (char*)SDL_malloc(GPU_ERROR_FUNCTION_STRING_MAX+1);
        _gpu_error_code_result.error = GPU_ERROR_NONE;
        _gpu_error_code_result.details = (char*)SDL_malloc(GPU_ERROR_DETAILS_STRING_MAX+1);
    }
}